

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O1

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::RemoveFieldInfo,duckdb::AlterEntryData,duckdb::vector<std::__cxx11::string,true>const&,bool_const&,bool_const&>
          (duckdb *this,AlterEntryData *args,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *args_1,bool *args_2,bool *args_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  RemoveFieldInfo *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_b0;
  AlterEntryData local_98;
  
  this_00 = (RemoveFieldInfo *)operator_new(0x98);
  paVar2 = &local_98.catalog.field_2;
  local_98.catalog._M_dataplus._M_p = (args->catalog)._M_dataplus._M_p;
  paVar1 = &(args->catalog).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p == paVar1) {
    local_98.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.catalog.field_2._8_8_ = *(undefined8 *)((long)&(args->catalog).field_2 + 8);
    local_98.catalog._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.catalog._M_string_length = (args->catalog)._M_string_length;
  paVar3 = &local_98.schema.field_2;
  (args->catalog)._M_dataplus._M_p = (pointer)paVar1;
  (args->catalog)._M_string_length = 0;
  (args->catalog).field_2._M_local_buf[0] = '\0';
  local_98.schema._M_dataplus._M_p = (args->schema)._M_dataplus._M_p;
  paVar1 = &(args->schema).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p == paVar1) {
    local_98.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.schema.field_2._8_8_ = *(undefined8 *)((long)&(args->schema).field_2 + 8);
    local_98.schema._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_98.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.schema._M_string_length = (args->schema)._M_string_length;
  paVar4 = &local_98.name.field_2;
  (args->schema)._M_dataplus._M_p = (pointer)paVar1;
  (args->schema)._M_string_length = 0;
  (args->schema).field_2._M_local_buf[0] = '\0';
  local_98.name._M_dataplus._M_p = (args->name)._M_dataplus._M_p;
  paVar1 = &(args->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p == paVar1) {
    local_98.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.name.field_2._8_8_ = *(undefined8 *)((long)&(args->name).field_2 + 8);
    local_98.name._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_98.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.name._M_string_length = (args->name)._M_string_length;
  (args->name)._M_dataplus._M_p = (pointer)paVar1;
  (args->name)._M_string_length = 0;
  (args->name).field_2._M_local_buf[0] = '\0';
  local_98.if_not_found = args->if_not_found;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_b0,
           &args_1->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  RemoveFieldInfo::RemoveFieldInfo(this_00,&local_98,&local_b0,*args_2,*args_3);
  *(RemoveFieldInfo **)this = this_00;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar4) {
    operator_delete(local_98.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p != paVar3) {
    operator_delete(local_98.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}